

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

int __thiscall Omega_h::InputScalar::get<int>(InputScalar *this)

{
  bool bVar1;
  Input *input;
  int out;
  string full_name;
  int local_34;
  string local_30;
  
  bVar1 = as(this,&local_34);
  if (bVar1) {
    return local_34;
  }
  get_full_name_abi_cxx11_(&local_30,(Omega_h *)this,input);
  fail("InputScalar \"%s\" string \"%s\" is not interpretable as a %s",local_30._M_dataplus._M_p,
       (this->str)._M_dataplus._M_p,"int");
}

Assistant:

T InputScalar::get() const {
  T out;
  if (!as(out)) {
    auto full_name = get_full_name(*this);
    Omega_h_fail(
        "InputScalar \"%s\" string \"%s\" is not interpretable as a %s",
        full_name.c_str(), str.c_str(),
        (std::is_same<T, int>::value
                ? "int"
                : (std::is_same<T, double>::value
                          ? "double"
                          : (std::is_same<T, long long>::value
                                    ? "long long"
                                    : "unknown type"))));
  }
  return out;
}